

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcompelwithmem.h
# Opt level: O0

void __thiscall
TPZCompElWithMem<TPZMultiphysicsCompEl<pzgeom::TPZGeoPoint>_>::SetIntegrationRule
          (TPZCompElWithMem<TPZMultiphysicsCompEl<pzgeom::TPZGeoPoint>_> *this,int ord)

{
  int iVar1;
  TPZIntPoints *pTVar2;
  int64_t iVar3;
  TPZMultiphysicsCompEl<pzgeom::TPZGeoPoint> *in_RDI;
  int in_stack_0000000c;
  TPZMultiphysicsCompEl<pzgeom::TPZGeoPoint> *in_stack_00000010;
  int intrulepoints;
  TPZIntPoints *intrule;
  
  TPZMultiphysicsCompEl<pzgeom::TPZGeoPoint>::SetIntegrationRule
            (in_stack_00000010,in_stack_0000000c);
  pTVar2 = TPZMultiphysicsCompEl<pzgeom::TPZGeoPoint>::GetIntegrationRule(in_RDI);
  iVar1 = (*pTVar2->_vptr_TPZIntPoints[3])();
  iVar3 = TPZVec<long>::size((TPZVec<long> *)(in_RDI + 1));
  if (iVar1 != iVar3) {
    (**(code **)(*(long *)&(in_RDI->super_TPZMultiphysicsElement).super_TPZCompEl + 0x178))();
    (**(code **)(*(long *)&(in_RDI->super_TPZMultiphysicsElement).super_TPZCompEl + 0x168))();
  }
  return;
}

Assistant:

inline void TPZCompElWithMem<TBASE>::SetIntegrationRule(int ord)
{
    TBASE::SetIntegrationRule(ord);
    // verify if the number of integration points changed
    const TPZIntPoints &intrule = TBASE::GetIntegrationRule();
    int intrulepoints = intrule.NPoints();
    if (intrulepoints != fIntPtIndices.size()) {
        SetFreeIntPtIndices();
        PrepareIntPtIndices();
    }
    
}